

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall
llm_build_qwen2moe::llm_build_qwen2moe
          (llm_build_qwen2moe *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *plVar2;
  pointer plVar3;
  ggml_context *pgVar4;
  ggml_tensor *pgVar5;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *cur;
  char *pcVar12;
  int il;
  long lVar13;
  long lVar14;
  float __x;
  float fVar15;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar16;
  ggml_tensor *local_70;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar2 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar2->n_embd_head_v;
  if (uVar1 == plVar2->n_embd_head_k) {
    if (uVar1 == plVar2->n_rot) {
      local_70 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
      pgVar5 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
      inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
      if (0 < (this->super_llm_graph_context).n_layer) {
        __x = (float)uVar1;
        lVar14 = 0;
        lVar13 = 0;
        do {
          uVar16 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
          il = (int)lVar13;
          pgVar6 = llm_graph_context::build_norm
                             (&this->super_llm_graph_context,local_70,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->attn_norm +
                               lVar14),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"attn_norm",il);
          pgVar7 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wq + lVar14),
                              pgVar6);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur",il);
          if (*(long *)((long)&((model->layers).
                                super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                _M_impl.super__Vector_impl_data._M_start)->bq + lVar14) != 0) {
            pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar7);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur",il);
          }
          pgVar8 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wk + lVar14),
                              pgVar6);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur",il);
          if (*(long *)((long)&((model->layers).
                                super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                _M_impl.super__Vector_impl_data._M_start)->bk + lVar14) != 0) {
            pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur",il);
          }
          pgVar6 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wv + lVar14),
                              pgVar6);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Vcur",il);
          if (*(long *)((long)&((model->layers).
                                super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                _M_impl.super__Vector_impl_data._M_start)->bv + lVar14) != 0) {
            pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Vcur",il);
          }
          uVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar7,uVar1,
                                  (this->super_llm_graph_context).n_head,
                                  (long)(this->super_llm_graph_context).n_tokens);
          uVar10 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar8,uVar1,
                                   (this->super_llm_graph_context).n_head_kv,
                                   (long)(this->super_llm_graph_context).n_tokens);
          pgVar8 = (ggml_tensor *)
                   ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar1,
                                   (this->super_llm_graph_context).n_head_kv,
                                   (long)(this->super_llm_graph_context).n_tokens);
          pgVar11 = (ggml_tensor *)
                    ggml_rope_ext((this->super_llm_graph_context).freq_base,
                                  (this->super_llm_graph_context).freq_scale,
                                  (this->super_llm_graph_context).ext_factor,
                                  (this->super_llm_graph_context).attn_factor,
                                  (this->super_llm_graph_context).beta_fast,
                                  (this->super_llm_graph_context).beta_slow,
                                  (this->super_llm_graph_context).ctx0,uVar9,pgVar5,0,
                                  (int)(this->super_llm_graph_context).n_rot,
                                  (this->super_llm_graph_context).rope_type,
                                  CONCAT44(uVar16,(this->super_llm_graph_context).n_ctx_orig));
          cur = (ggml_tensor *)
                ggml_rope_ext((this->super_llm_graph_context).freq_base,
                              (this->super_llm_graph_context).freq_scale,
                              (this->super_llm_graph_context).ext_factor,
                              (this->super_llm_graph_context).attn_factor,
                              (this->super_llm_graph_context).beta_fast,
                              (this->super_llm_graph_context).beta_slow,
                              (this->super_llm_graph_context).ctx0,uVar10,pgVar5,0,
                              (int)(this->super_llm_graph_context).n_rot,
                              (this->super_llm_graph_context).rope_type,
                              (this->super_llm_graph_context).n_ctx_orig);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"Qcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,cur,"Kcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Vcur",il);
          plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pgVar6 = *(ggml_tensor **)((long)&plVar3->wo + lVar14);
          pgVar7 = *(ggml_tensor **)((long)&plVar3->bo + lVar14);
          fVar15 = SQRT(__x);
          if (__x < 0.0) {
            fVar15 = sqrtf(__x);
          }
          pgVar6 = llm_graph_context::build_attn
                             (&this->super_llm_graph_context,inp,gf,pgVar6,pgVar7,pgVar11,cur,pgVar8
                              ,(ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0 / fVar15,il);
          if (lVar13 == (this->super_llm_graph_context).n_layer + -1) {
            pgVar7 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
            pgVar6 = (ggml_tensor *)
                     ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar6,pgVar7);
            local_70 = (ggml_tensor *)
                       ggml_get_rows((this->super_llm_graph_context).ctx0,local_70,pgVar7);
          }
          pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6,local_70);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_inp",il);
          pgVar7 = llm_graph_context::build_norm
                             (&this->super_llm_graph_context,pgVar6,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ffn_norm +
                               lVar14),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_norm",il);
          plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pgVar8 = llm_graph_context::build_moe_ffn
                             (&this->super_llm_graph_context,pgVar7,
                              *(ggml_tensor **)((long)&plVar3->ffn_gate_inp + lVar14),
                              *(ggml_tensor **)((long)&plVar3->ffn_up_exps + lVar14),
                              *(ggml_tensor **)((long)&plVar3->ffn_gate_exps + lVar14),
                              *(ggml_tensor **)((long)&plVar3->ffn_down_exps + lVar14),
                              (ggml_tensor *)0x0,(this->super_llm_graph_context).n_expert,
                              (this->super_llm_graph_context).n_expert_used,LLM_FFN_SILU,false,false
                              ,0.0,LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_moe_out",il);
          pgVar11 = llm_graph_context::build_lora_mm
                              (&this->super_llm_graph_context,
                               *(ggml_tensor **)
                                ((long)&((model->layers).
                                         super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                        ffn_gate_inp_shexp + lVar14),pgVar7);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_shexp_gate_inp",il);
          pgVar4 = (this->super_llm_graph_context).ctx0;
          uVar9 = ggml_silu(pgVar4,pgVar11);
          pgVar11 = (ggml_tensor *)ggml_div(pgVar4,uVar9,pgVar11);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_shexp_gate",il);
          plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          in_stack_ffffffffffffff38 = 0;
          pgVar7 = llm_graph_context::build_ffn
                             (&this->super_llm_graph_context,pgVar7,
                              *(ggml_tensor **)((long)&plVar3->ffn_up_shexp + lVar14),
                              (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                              *(ggml_tensor **)((long)&plVar3->ffn_gate_shexp + lVar14),
                              (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                              *(ggml_tensor **)((long)&plVar3->ffn_down_shexp + lVar14),
                              (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,
                              LLM_FFN_PAR,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_shexp",il);
          pgVar7 = (ggml_tensor *)ggml_mul((this->super_llm_graph_context).ctx0,pgVar7,pgVar11);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_shexp_out",il);
          pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8,pgVar7);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_out",il);
          pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar7,pgVar6);
          local_70 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar6,il);
          llm_graph_context::cb(&this->super_llm_graph_context,local_70,"l_out",il);
          lVar13 = lVar13 + 1;
          lVar14 = lVar14 + 0x4f0;
        } while (lVar13 < (this->super_llm_graph_context).n_layer);
      }
      pgVar5 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_70,model->output_norm,
                          (ggml_tensor *)0x0,LLM_NORM_RMS,-1);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_norm",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar5;
      pgVar5 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar5)
      ;
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_output",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar5;
      ggml_build_forward_expand(gf,pgVar5);
      return;
    }
    pcVar12 = "n_embd_head == hparams.n_rot";
    uVar9 = 0x19bc;
  }
  else {
    pcVar12 = "n_embd_head == hparams.n_embd_head_k";
    uVar9 = 0x19bb;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,uVar9,"GGML_ASSERT(%s) failed",pcVar12);
}

Assistant:

llm_build_qwen2moe(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self_attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // MoE branch
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            ggml_tensor * moe_out =
                build_moe_ffn(cur,
                        model.layers[il].ffn_gate_inp,
                        model.layers[il].ffn_up_exps,
                        model.layers[il].ffn_gate_exps,
                        model.layers[il].ffn_down_exps,
                        nullptr,
                        n_expert, n_expert_used,
                        LLM_FFN_SILU, false,
                        false, 0.0,
                        LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                        il);
            cb(moe_out, "ffn_moe_out", il);

            // FFN shared expert
            {
                ggml_tensor * cur_gate_inp = build_lora_mm(model.layers[il].ffn_gate_inp_shexp, cur);
                cb(cur_gate_inp, "ffn_shexp_gate_inp", il);

                // sigmoid
                ggml_tensor * cur_gate = ggml_div(ctx0, ggml_silu(ctx0, cur_gate_inp), cur_gate_inp);
                cb(cur_gate, "ffn_shexp_gate", il);

                ggml_tensor * cur_ffn = build_ffn(cur,
                        model.layers[il].ffn_up_shexp,   NULL, NULL,
                        model.layers[il].ffn_gate_shexp, NULL, NULL,
                        model.layers[il].ffn_down_shexp, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur_ffn, "ffn_shexp", il);

                ggml_tensor * ffn_shexp_out = ggml_mul(ctx0, cur_ffn, cur_gate);
                cb(ffn_shexp_out, "ffn_shexp_out", il);

                moe_out = ggml_add(ctx0, moe_out, ffn_shexp_out);
                cb(moe_out, "ffn_out", il);

                cur = moe_out;
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }